

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

bool __thiscall
draco::PlyReader::ParseElementData(PlyReader *this,DecoderBuffer *buffer,int element_index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference this_00;
  PlyProperty *this_01;
  int in_EDX;
  DecoderBuffer *in_RSI;
  vector<draco::PlyElement,_std::allocator<draco::PlyElement>_> *in_RDI;
  int64_t num_bytes_to_read;
  int64_t num_entries;
  PlyProperty *prop;
  int i;
  int entry;
  PlyElement *element;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  PlyElement *in_stack_ffffffffffffff40;
  DecoderBuffer *in_stack_ffffffffffffff48;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  int iVar4;
  iterator in_stack_ffffffffffffff88;
  int local_28;
  int local_24;
  
  this_00 = std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::operator[]
                      (in_RDI,(long)in_EDX);
  local_24 = 0;
  while( true ) {
    iVar4 = local_24;
    iVar2 = PlyElement::num_entries(this_00);
    if (iVar2 <= iVar4) break;
    local_28 = 0;
    while( true ) {
      iVar2 = local_28;
      iVar3 = PlyElement::num_properties((PlyElement *)0x13ecff);
      if (iVar3 <= iVar2) break;
      this_01 = PlyElement::property(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      bVar1 = PlyProperty::is_list(this_01);
      if (bVar1) {
        PlyProperty::list_data_type_num_bytes(this_01);
        DecoderBuffer::Decode
                  (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this_01->data_);
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff40,
                   (value_type_conflict4 *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        std::vector<long,_std::allocator<long>_>::push_back
                  (in_stack_ffffffffffffff50,(value_type_conflict4 *)in_stack_ffffffffffffff48);
        PlyProperty::data_type_num_bytes(this_01);
        in_stack_ffffffffffffff70 = &this_01->data_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_ffffffffffffff40,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        in_stack_ffffffffffffff78 = DecoderBuffer::data_head(in_RSI);
        DecoderBuffer::data_head(in_RSI);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(iVar4,iVar2),
                   (const_iterator)in_stack_ffffffffffffff88._M_current,in_stack_ffffffffffffff78,
                   (char *)in_stack_ffffffffffffff70);
        DecoderBuffer::Advance(in_RSI,0);
      }
      else {
        in_stack_ffffffffffffff48 = (DecoderBuffer *)&this_01->data_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_ffffffffffffff40,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        in_stack_ffffffffffffff50 =
             (vector<long,_std::allocator<long>_> *)DecoderBuffer::data_head(in_RSI);
        in_stack_ffffffffffffff40 = (PlyElement *)DecoderBuffer::data_head(in_RSI);
        PlyProperty::data_type_num_bytes(this_01);
        in_stack_ffffffffffffff88 =
             std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(iVar4,iVar2),in_stack_ffffffffffffff88._M_current,
                        in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
        iVar2 = PlyProperty::data_type_num_bytes(this_01);
        DecoderBuffer::Advance(in_RSI,(long)iVar2);
      }
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool PlyReader::ParseElementData(DecoderBuffer *buffer, int element_index) {
  PlyElement &element = elements_[element_index];
  for (int entry = 0; entry < element.num_entries(); ++entry) {
    for (int i = 0; i < element.num_properties(); ++i) {
      PlyProperty &prop = element.property(i);
      if (prop.is_list()) {
        // Parse the number of entries for the list element.
        int64_t num_entries = 0;
        buffer->Decode(&num_entries, prop.list_data_type_num_bytes());
        // Store offset to the main data entry.
        prop.list_data_.push_back(prop.data_.size() /
                                  prop.data_type_num_bytes_);
        // Store the number of entries.
        prop.list_data_.push_back(num_entries);
        // Read and store the actual property data
        const int64_t num_bytes_to_read =
            prop.data_type_num_bytes() * num_entries;
        prop.data_.insert(prop.data_.end(), buffer->data_head(),
                          buffer->data_head() + num_bytes_to_read);
        buffer->Advance(num_bytes_to_read);
      } else {
        // Non-list property
        prop.data_.insert(prop.data_.end(), buffer->data_head(),
                          buffer->data_head() + prop.data_type_num_bytes());
        buffer->Advance(prop.data_type_num_bytes());
      }
    }
  }
  return true;
}